

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O3

void av1_lowbd_inv_txfm2d_add_avx2
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  undefined2 uVar1;
  char cVar2;
  uint uVar3;
  transform_1d_avx2 p_Var4;
  transform_1d_ssse3 p_Var5;
  char *pcVar6;
  byte *pbVar7;
  transform_1d_avx2 p_Var8;
  undefined8 uVar9;
  __m256i alVar10;
  uint uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  longlong lVar14;
  longlong lVar15;
  longlong lVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  int8_t *piVar22;
  uint uVar23;
  undefined1 (*pauVar24) [32];
  undefined1 (*pauVar25) [32];
  __m256i *palVar26;
  undefined1 *puVar27;
  ulong uVar28;
  uint uVar29;
  int iVar30;
  undefined8 *puVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  __m256i *out;
  __m256i *palVar38;
  int iVar39;
  undefined1 (*pauVar40) [16];
  long lVar41;
  byte bVar42;
  undefined7 in_register_00000081;
  uint uVar43;
  int iVar44;
  undefined8 *puVar45;
  ulong uVar46;
  uint uVar47;
  uint uVar48;
  int iVar49;
  ulong uVar50;
  bool bVar51;
  undefined2 uVar52;
  undefined4 uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  __m128i alVar55;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  __m256i buf0 [64];
  __m128i buf1 [8];
  ulong local_8c10;
  int local_8c00;
  undefined2 local_8ba0;
  undefined2 uStack_8b9e;
  short sStack_8b9c;
  int local_8b00;
  undefined2 local_8ac0;
  short sStack_8abe;
  short sStack_8abc;
  undefined1 local_8aa0 [32];
  undefined1 local_8a80 [32];
  longlong local_8a60 [64];
  undefined1 local_8860 [32];
  undefined1 local_8840 [32];
  undefined1 local_8820 [32];
  undefined1 local_8800 [1952];
  undefined1 local_8060 [32];
  undefined1 local_8040 [32];
  undefined1 local_8020 [32];
  undefined1 local_8000 [1022] [32];
  undefined1 auVar81 [32];
  undefined1 auVar85 [32];
  undefined1 auVar89 [32];
  
  piVar22 = av1_inv_txfm_shift_ls[1];
  uVar48 = (uint)CONCAT71(in_register_00000081,tx_size);
  if (uVar48 < 0x11) {
    if ((0x1e1e1U >> (uVar48 & 0x1f) & 1) != 0) goto switchD_0042a93d_default;
    if (uVar48 == 1) {
      if (tx_type < 0x10) {
        uVar48 = (uint)tx_type;
        if ((0x5400U >> (uVar48 & 0x1f) & 1) != 0) {
          av1_lowbd_inv_txfm2d_add_h_identity_ssse3(input,output,stride,tx_type,'\x01',eob);
          return;
        }
        if ((0xa800U >> (uVar48 & 0x1f) & 1) != 0) {
          av1_lowbd_inv_txfm2d_add_v_identity_ssse3(input,output,stride,tx_type,'\x01',eob);
          return;
        }
        if (uVar48 == 9) {
          av1_lowbd_inv_txfm2d_add_idtx_ssse3(input,output,stride,'\x01');
          return;
        }
      }
      bVar51 = 8 < tx_type;
      uVar48 = 0xaf >> (tx_type & 0x1f);
      p_Var5 = lowbd_txfm_all_1d_zeros_8x8_arr[""[tx_type]][eob != 1];
      auVar69 = vpackssdw_avx2(*(undefined1 (*) [32])input,*(undefined1 (*) [32])(input + 8));
      auVar74 = vpackssdw_avx2(*(undefined1 (*) [32])(input + 0x10),
                               *(undefined1 (*) [32])(input + 0x18));
      auVar71 = vpackssdw_avx2(*(undefined1 (*) [32])(input + 0x20),
                               *(undefined1 (*) [32])(input + 0x28));
      auVar59 = vpackssdw_avx2(*(undefined1 (*) [32])(input + 0x30),
                               *(undefined1 (*) [32])(input + 0x38));
      local_8860 = vpermq_avx2(auVar69,0xd8);
      local_8840 = vpermq_avx2(auVar74,0xd8);
      local_8820 = vpermq_avx2(auVar71,0xd8);
      local_8800._0_32_ = vpermq_avx2(auVar59,0xd8);
      (*lowbd_txfm_all_1d_zeros_8x8_arr[""[tx_type]][eob != 1])
                ((__m128i *)local_8860,(__m128i *)local_8860);
      if ((0x11fU >> (tx_type & 0x1f) & 1) == 0 && !bVar51) {
        auVar69._0_16_ = ZEXT116(0) * local_8840._16_16_ + ZEXT116(1) * local_8800._16_16_;
        auVar69._16_16_ = ZEXT116(1) * local_8840._16_16_;
        auVar74._0_16_ = ZEXT116(0) * local_8840._0_16_ + ZEXT116(1) * local_8800._0_16_;
        auVar74._16_16_ = ZEXT116(1) * local_8840._0_16_;
        auVar71._0_16_ = ZEXT116(0) * local_8860._16_16_ + ZEXT116(1) * local_8820._16_16_;
        auVar71._16_16_ = ZEXT116(1) * local_8860._16_16_;
        alVar55 = (__m128i)local_8860._0_16_;
        auVar68 = local_8820._0_16_;
      }
      else {
        auVar69._0_16_ = ZEXT116(0) * local_8820._0_16_ + ZEXT116(1) * local_8860._0_16_;
        auVar69._16_16_ = ZEXT116(1) * local_8820._0_16_;
        auVar74._0_16_ = ZEXT116(0) * local_8820._16_16_ + ZEXT116(1) * local_8860._16_16_;
        auVar74._16_16_ = ZEXT116(1) * local_8820._16_16_;
        auVar71._0_16_ = ZEXT116(0) * local_8800._0_16_ + ZEXT116(1) * local_8840._0_16_;
        auVar71._16_16_ = ZEXT116(1) * local_8800._0_16_;
        alVar55 = (__m128i)local_8800._16_16_;
        auVar68 = local_8840._16_16_;
      }
      auVar80._0_2_ = (undefined2)(1 << (*piVar22 + 0xfU & 0x1f));
      auVar80._2_2_ = auVar80._0_2_;
      auVar80._4_2_ = auVar80._0_2_;
      auVar80._6_2_ = auVar80._0_2_;
      auVar80._8_2_ = auVar80._0_2_;
      auVar80._10_2_ = auVar80._0_2_;
      auVar80._12_2_ = auVar80._0_2_;
      auVar80._14_2_ = auVar80._0_2_;
      auVar80._16_2_ = auVar80._0_2_;
      auVar80._18_2_ = auVar80._0_2_;
      auVar80._20_2_ = auVar80._0_2_;
      auVar80._22_2_ = auVar80._0_2_;
      auVar80._24_2_ = auVar80._0_2_;
      auVar80._26_2_ = auVar80._0_2_;
      auVar80._28_2_ = auVar80._0_2_;
      auVar80._30_2_ = auVar80._0_2_;
      auVar59._0_16_ = ZEXT116(0) * (undefined1  [16])alVar55 + ZEXT116(1) * auVar68;
      auVar59._16_16_ = ZEXT116(1) * (undefined1  [16])alVar55;
      auVar69 = vpmulhrsw_avx2(auVar69,auVar80);
      auVar74 = vpmulhrsw_avx2(auVar74,auVar80);
      auVar71 = vpmulhrsw_avx2(auVar71,auVar80);
      auVar59 = vpmulhrsw_avx2(auVar59,auVar80);
      auVar80 = vpunpcklwd_avx2(auVar69,auVar74);
      auVar69 = vpunpckhwd_avx2(auVar69,auVar74);
      auVar60 = vpunpcklwd_avx2(auVar71,auVar59);
      auVar74 = vpunpckhwd_avx2(auVar71,auVar59);
      auVar71 = vpunpckldq_avx2(auVar80,auVar60);
      local_8060 = vpermq_avx2(auVar71,0xd8);
      auVar71 = vpunpckhdq_avx2(auVar80,auVar60);
      local_8040 = vpermq_avx2(auVar71,0xd8);
      auVar71 = vpunpckldq_avx2(auVar69,auVar74);
      local_8020 = vpermq_avx2(auVar71,0xd8);
      auVar69 = vpunpckhdq_avx2(auVar69,auVar74);
      local_8000[0] = vpermq_avx2(auVar69,0xd8);
      (*p_Var5)((__m128i *)local_8060,(__m128i *)local_8060);
      uVar23 = ((byte)((byte)uVar48 | bVar51) & 1) - 1 | 1;
      iVar39 = 7;
      pauVar24 = local_8000;
      if ((uVar48 & 1) != 0 || bVar51) {
        iVar39 = 0;
        pauVar24 = (undefined1 (*) [32])(local_8060 + 0x10);
      }
      iVar30 = iVar39 + uVar23 * 2;
      auVar66._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])*pauVar24 +
           ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (uint)(iVar39 << 4));
      auVar66._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])*pauVar24;
      iVar39 = iVar30 + uVar23 * 2;
      auVar70._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar30 + uVar23) * 0x10) +
           ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)iVar30 * 0x10);
      auVar70._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar30 + uVar23) * 0x10);
      iVar30 = iVar39 + uVar23 * 2;
      auVar72._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar39 + uVar23) * 0x10) +
           ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)iVar39 * 0x10);
      auVar72._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar39 + uVar23) * 0x10);
      auVar60._0_2_ = (undefined2)(1 << (piVar22[1] + 0xfU & 0x1f));
      auVar60._2_2_ = auVar60._0_2_;
      auVar60._4_2_ = auVar60._0_2_;
      auVar60._6_2_ = auVar60._0_2_;
      auVar60._8_2_ = auVar60._0_2_;
      auVar60._10_2_ = auVar60._0_2_;
      auVar60._12_2_ = auVar60._0_2_;
      auVar60._14_2_ = auVar60._0_2_;
      auVar60._16_2_ = auVar60._0_2_;
      auVar60._18_2_ = auVar60._0_2_;
      auVar60._20_2_ = auVar60._0_2_;
      auVar60._22_2_ = auVar60._0_2_;
      auVar60._24_2_ = auVar60._0_2_;
      auVar60._26_2_ = auVar60._0_2_;
      auVar60._28_2_ = auVar60._0_2_;
      auVar60._30_2_ = auVar60._0_2_;
      auVar75._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar30 + uVar23) * 0x10) +
           ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)iVar30 * 0x10);
      auVar75._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar30 + uVar23) * 0x10);
      auVar69 = vpmulhrsw_avx2(auVar66,auVar60);
      auVar74 = vpmulhrsw_avx2(auVar70,auVar60);
      auVar71 = vpmulhrsw_avx2(auVar72,auVar60);
      auVar59 = vpmulhrsw_avx2(auVar75,auVar60);
      lVar41 = (long)stride;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = *(ulong *)(output + lVar41);
      auVar78._8_8_ = 0;
      auVar78._0_8_ = *(ulong *)output;
      auVar76._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar78;
      auVar76._16_16_ = ZEXT116(1) * auVar68;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = *(ulong *)(output + lVar41 * 3);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = *(ulong *)(output + lVar41 * 2);
      auVar81._0_16_ = ZEXT116(0) * auVar79 + ZEXT116(1) * auVar82;
      auVar81._16_16_ = ZEXT116(1) * auVar79;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = *(ulong *)(output + lVar41 * 5);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = *(ulong *)(output + lVar41 * 4);
      auVar85._0_16_ = ZEXT116(0) * auVar83 + ZEXT116(1) * auVar87;
      auVar85._16_16_ = ZEXT116(1) * auVar83;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = *(ulong *)(output + lVar41 * 7);
      auVar90._8_8_ = 0;
      auVar90._0_8_ = *(ulong *)(output + lVar41 * 6);
      auVar89._0_16_ = ZEXT116(0) * auVar88 + ZEXT116(1) * auVar90;
      auVar89._16_16_ = ZEXT116(1) * auVar88;
      auVar80 = vpunpcklbw_avx2(auVar76,ZEXT1632((undefined1  [16])0x0));
      auVar69 = vpaddsw_avx2(auVar69,auVar80);
      auVar80 = vpunpcklbw_avx2(auVar81,ZEXT1632((undefined1  [16])0x0));
      auVar74 = vpaddsw_avx2(auVar74,auVar80);
      auVar69 = vpackuswb_avx2(auVar69,auVar74);
      auVar74 = vpunpcklbw_avx2(auVar85,ZEXT1632((undefined1  [16])0x0));
      auVar74 = vpaddsw_avx2(auVar71,auVar74);
      auVar71 = vpunpcklbw_avx2(auVar89,ZEXT1632((undefined1  [16])0x0));
      auVar71 = vpaddsw_avx2(auVar59,auVar71);
      *(long *)output = auVar69._0_8_;
      *(long *)(output + lVar41) = auVar69._16_8_;
      uVar9 = vpextrq_avx(auVar69._0_16_,1);
      *(undefined8 *)(output + lVar41 * 2) = uVar9;
      uVar9 = vpextrq_avx(auVar69._16_16_,1);
      *(undefined8 *)(output + lVar41 * 3) = uVar9;
      auVar69 = vpackuswb_avx2(auVar74,auVar71);
      *(long *)(output + lVar41 * 4) = auVar69._0_8_;
      *(long *)(output + lVar41 * 5) = auVar69._16_8_;
      uVar9 = vpextrq_avx(auVar69._0_16_,1);
      *(undefined8 *)(output + lVar41 * 6) = uVar9;
      uVar9 = vpextrq_avx(auVar69._16_16_,1);
      *(undefined8 *)(output + lVar41 * 7) = uVar9;
      return;
    }
  }
  uVar28 = (ulong)tx_type;
  switch(uVar28) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    break;
  case 9:
    uVar28 = (ulong)((uint)tx_size * 4);
    iVar39 = *(int *)((long)tx_size_wide + uVar28);
    iVar30 = *(int *)((long)tx_size_high + uVar28);
    iVar35 = 0x20;
    if (iVar39 < 0x20) {
      iVar35 = iVar39;
    }
    iVar44 = 0x20;
    if (iVar30 < 0x20) {
      iVar44 = iVar30;
    }
    iVar49 = 0;
    if (iVar39 != iVar30) {
      if (iVar30 < iVar39) {
        iVar49 = 1;
        if ((iVar30 * 2 == iVar39) || (iVar49 = 2, iVar30 << 2 == iVar39)) goto LAB_0042bba6;
      }
      else {
        iVar49 = -1;
        if ((iVar39 * 2 == iVar30) || (iVar49 = -2, iVar39 << 2 == iVar30)) goto LAB_0042bba6;
      }
      iVar49 = 0;
    }
LAB_0042bba6:
    if (iVar35 >> 4 < 1) {
      return;
    }
    pcVar6 = av1_inv_txfm_shift_ls[tx_size];
    iVar39 = *(int *)((long)tx_size_wide_log2 + uVar28);
    iVar30 = *(int *)((long)tx_size_high_log2 + uVar28);
    sStack_8b9c = (short)(iVar30 >> 0x1f);
    lVar41 = (long)iVar44 * 4;
    local_8c10 = 0;
    auVar77._8_2_ = 0x5a80;
    auVar77._0_8_ = 0x5a805a805a805a80;
    auVar77._10_2_ = 0x5a80;
    auVar77._12_2_ = 0x5a80;
    auVar77._14_2_ = 0x5a80;
    auVar77._16_2_ = 0x5a80;
    auVar77._18_2_ = 0x5a80;
    auVar77._20_2_ = 0x5a80;
    auVar77._22_2_ = 0x5a80;
    auVar77._24_2_ = 0x5a80;
    auVar77._26_2_ = 0x5a80;
    auVar77._28_2_ = 0x5a80;
    auVar77._30_2_ = 0x5a80;
    auVar86._8_2_ = 1;
    auVar86._0_8_ = 0x1000100010001;
    auVar86._10_2_ = 1;
    auVar86._12_2_ = 1;
    auVar86._14_2_ = 1;
    auVar86._16_2_ = 1;
    auVar86._18_2_ = 1;
    auVar86._20_2_ = 1;
    auVar86._22_2_ = 1;
    auVar86._24_2_ = 1;
    auVar86._26_2_ = 1;
    auVar86._28_2_ = 1;
    auVar86._30_2_ = 1;
    auVar61._8_2_ = 0x800;
    auVar61._0_8_ = 0x800080008000800;
    auVar61._10_2_ = 0x800;
    auVar61._12_2_ = 0x800;
    auVar61._14_2_ = 0x800;
    auVar61._16_2_ = 0x800;
    auVar61._18_2_ = 0x800;
    auVar61._20_2_ = 0x800;
    auVar61._22_2_ = 0x800;
    auVar61._24_2_ = 0x800;
    auVar61._26_2_ = 0x800;
    auVar61._28_2_ = 0x800;
    auVar61._30_2_ = 0x800;
    do {
      if (0 < iVar44 >> 4) {
        uVar52 = (undefined2)tx_size_high_log2[(long)iVar39 + 0x12];
        uVar28 = 0;
        pauVar24 = (undefined1 (*) [32])input;
        do {
          cVar2 = *pcVar6;
          uVar48 = 0xc - (int)cVar2;
          auVar21._2_2_ = uVar52;
          auVar21._0_2_ = uVar52;
          auVar21._4_2_ = uVar52;
          auVar21._6_2_ = uVar52;
          auVar21._8_2_ = uVar52;
          auVar21._10_2_ = uVar52;
          auVar21._12_2_ = uVar52;
          auVar21._14_2_ = uVar52;
          auVar68 = vpunpcklwd_avx(auVar21,ZEXT416((1 << (0xbU - cVar2 & 0x1f)) + 0x800));
          auVar62._0_4_ = auVar68._0_4_;
          auVar62._4_4_ = auVar62._0_4_;
          auVar62._8_4_ = auVar62._0_4_;
          auVar62._12_4_ = auVar62._0_4_;
          auVar62._16_4_ = auVar62._0_4_;
          auVar62._20_4_ = auVar62._0_4_;
          auVar62._24_4_ = auVar62._0_4_;
          auVar62._28_4_ = auVar62._0_4_;
          if ((iVar49 == -1) || (iVar49 == 1)) {
            lVar33 = 0;
            pauVar25 = pauVar24;
            do {
              auVar69 = vlddqu_avx(*pauVar25);
              auVar69 = vpackssdw_avx2(auVar69,pauVar25[1]);
              auVar69 = vpermq_avx2(auVar69,0xd8);
              auVar69 = vpmulhrsw_avx2(auVar69,auVar77);
              auVar74 = vpunpcklwd_avx2(auVar69,auVar86);
              auVar71 = vpunpckhwd_avx2(auVar69,auVar86);
              auVar69 = vpmaddwd_avx2(auVar74,auVar62);
              auVar74 = vpsrad_avx2(auVar69,ZEXT416(uVar48));
              auVar69 = vpmaddwd_avx2(auVar71,auVar62);
              auVar69 = vpsrad_avx2(auVar69,ZEXT416(uVar48));
              auVar69 = vpackssdw_avx2(auVar74,auVar69);
              *(undefined1 (*) [32])(local_8060 + lVar33) = auVar69;
              lVar33 = lVar33 + 0x20;
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + lVar41);
            } while (lVar33 != 0x200);
          }
          else {
            lVar33 = 0;
            pauVar25 = pauVar24;
            do {
              auVar69 = vlddqu_avx(*pauVar25);
              auVar69 = vpackssdw_avx2(auVar69,pauVar25[1]);
              auVar74 = vpermq_avx2(auVar69,0xd8);
              auVar69 = vpunpcklwd_avx2(auVar74,auVar86);
              auVar71 = vpunpckhwd_avx2(auVar74,auVar86);
              auVar69 = vpmaddwd_avx2(auVar69,auVar62);
              auVar74 = vpsrad_avx2(auVar69,ZEXT416(uVar48));
              auVar69 = vpmaddwd_avx2(auVar71,auVar62);
              auVar69 = vpsrad_avx2(auVar69,ZEXT416(uVar48));
              auVar69 = vpackssdw_avx2(auVar74,auVar69);
              *(undefined1 (*) [32])(local_8060 + lVar33) = auVar69;
              lVar33 = lVar33 + 0x20;
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + lVar41);
            } while (lVar33 != 0x200);
          }
          transpose_16bit_16x16_avx2((__m256i *)local_8060,(__m256i *)local_8060);
          pauVar40 = (undefined1 (*) [16])
                     (output + uVar28 * 0x10 * (long)stride + local_8c10 * 0x10);
          bVar42 = pcVar6[1];
          uVar1 = (undefined2)tx_size_high_log2[CONCAT26(sStack_8b9c,(int6)iVar30) + 0x12];
          auVar63._2_2_ = uVar1;
          auVar63._0_2_ = uVar1;
          auVar63._4_2_ = uVar1;
          auVar63._6_2_ = uVar1;
          auVar63._8_2_ = uVar1;
          auVar63._10_2_ = uVar1;
          auVar63._12_2_ = uVar1;
          auVar63._14_2_ = uVar1;
          auVar63._16_2_ = uVar1;
          auVar63._18_2_ = uVar1;
          auVar63._20_2_ = uVar1;
          auVar63._22_2_ = uVar1;
          auVar63._24_2_ = uVar1;
          auVar63._26_2_ = uVar1;
          auVar63._28_2_ = uVar1;
          auVar63._30_2_ = uVar1;
          auVar69 = vpunpcklwd_avx2(auVar63,auVar61);
          iVar36 = 1 << (~bVar42 & 0x1f);
          auVar67._4_4_ = iVar36;
          auVar67._0_4_ = iVar36;
          auVar67._8_4_ = iVar36;
          auVar67._12_4_ = iVar36;
          auVar67._16_4_ = iVar36;
          auVar67._20_4_ = iVar36;
          auVar67._24_4_ = iVar36;
          auVar67._28_4_ = iVar36;
          lVar33 = 0;
          do {
            auVar74 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_8060 + lVar33),auVar86);
            auVar71 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_8060 + lVar33),auVar86);
            auVar74 = vpmaddwd_avx2(auVar74,auVar69);
            auVar71 = vpmaddwd_avx2(auVar71,auVar69);
            auVar74 = vpsrad_avx2(auVar74,0xc);
            auVar71 = vpsrad_avx2(auVar71,0xc);
            auVar74 = vpaddd_avx2(auVar74,auVar67);
            auVar71 = vpaddd_avx2(auVar71,auVar67);
            auVar68 = ZEXT416((uint)-(int)(char)bVar42);
            auVar74 = vpsrad_avx2(auVar74,auVar68);
            auVar59 = vpsrad_avx2(auVar71,auVar68);
            auVar71 = vpmovzxbw_avx2(*pauVar40);
            auVar74 = vpackssdw_avx2(auVar74,auVar59);
            auVar74 = vpaddsw_avx2(auVar71,auVar74);
            auVar68 = vpackuswb_avx(auVar74._0_16_,auVar74._16_16_);
            *pauVar40 = auVar68;
            pauVar40 = (undefined1 (*) [16])(*pauVar40 + stride);
            lVar33 = lVar33 + 0x20;
          } while (lVar33 != 0x200);
          uVar28 = uVar28 + 1;
          pauVar24 = pauVar24 + 2;
        } while (uVar28 != (uint)(iVar44 >> 4));
      }
      local_8c10 = local_8c10 + 1;
      input = (int32_t *)((long)input + (long)iVar44 * 2 * 0x20);
    } while (local_8c10 != (uint)(iVar35 >> 4));
    return;
  case 10:
  case 0xc:
  case 0xe:
    uVar48 = tx_size_wide[tx_size];
    uVar23 = 0x20;
    if ((int)uVar48 < 0x20) {
      uVar23 = uVar48;
    }
    if (eob < (int)uVar23) {
      iVar39 = eob_fill[eob + -1];
    }
    else {
      iVar39 = uVar23 - 1;
    }
    uVar46 = (ulong)((uint)tx_size * 4);
    uVar3 = *(uint *)((long)tx_size_high + uVar46);
    uVar29 = 0x20;
    if ((int)uVar3 < 0x20) {
      uVar29 = uVar3;
    }
    local_8a80._0_4_ = iVar39 + 0x10 >> 4;
    iVar39 = 0;
    if (uVar48 != uVar3) {
      if ((int)uVar3 < (int)uVar48) {
        iVar39 = 1;
        if ((uVar3 * 2 == uVar48) || (iVar39 = 2, uVar3 * 4 == uVar48)) goto LAB_0042b11b;
      }
      else {
        iVar39 = -1;
        if ((uVar48 * 2 == uVar3) || (iVar39 = -2, uVar48 << 2 == uVar3)) goto LAB_0042b11b;
      }
      iVar39 = 0;
    }
LAB_0042b11b:
    if ((int)local_8a80._0_4_ < 1) {
      return;
    }
    pcVar6 = av1_inv_txfm_shift_ls[tx_size];
    iVar30 = *(int *)((long)tx_size_wide_log2 + uVar46);
    uVar48 = eob_fill[(eob + -1) / (int)uVar23] + 0x10 >> 4;
    p_Var8 = lowbd_txfm_all_1d_zeros_w16_arr[(long)*(int *)((long)tx_size_high_log2 + uVar46) + -2]
             [""[uVar28]][lowbd_txfm_all_1d_zeros_idx[eob_fill[(eob + -1) / (int)uVar23]]];
    bVar42 = (byte)(tx_type - 4) >> 1;
    bVar51 = 5 < (byte)(bVar42 | tx_type << 7);
    bVar42 = 0x18 >> (bVar42 & 0x1f);
    lVar41 = (long)(int)uVar3 + -1;
    if ((bVar42 & 1) != 0 || bVar51) {
      lVar41 = 0;
    }
    uVar28 = 1;
    if (1 < (int)uVar3) {
      uVar28 = (ulong)uVar3;
    }
    local_8a80._4_4_ = 0;
    lVar33 = 0;
    do {
      if (0 < (int)uVar48) {
        uVar52 = (undefined2)tx_size_high_log2[(long)iVar30 + 0x12];
        auVar54._2_2_ = uVar52;
        auVar54._0_2_ = uVar52;
        auVar54._4_2_ = uVar52;
        auVar54._6_2_ = uVar52;
        auVar54._8_2_ = uVar52;
        auVar54._10_2_ = uVar52;
        auVar54._12_2_ = uVar52;
        auVar54._14_2_ = uVar52;
        cVar2 = *pcVar6;
        pauVar24 = (undefined1 (*) [32])(input + local_8b00);
        auVar68 = vpunpcklwd_avx(auVar54,ZEXT416((1 << (0xbU - cVar2 & 0x1f)) + 0x800));
        uVar53 = auVar68._0_4_;
        auVar73._4_4_ = uVar53;
        auVar73._0_4_ = uVar53;
        auVar73._8_4_ = uVar53;
        auVar73._12_4_ = uVar53;
        auVar73._16_4_ = uVar53;
        auVar73._20_4_ = uVar53;
        auVar73._24_4_ = uVar53;
        auVar73._28_4_ = uVar53;
        puVar27 = local_8060;
        uVar46 = 0;
        do {
          auVar68 = ZEXT416(0xc - (int)cVar2);
          if ((iVar39 == -1) || (iVar39 == 1)) {
            lVar32 = 0;
            auVar17._8_2_ = 0x5a80;
            auVar17._0_8_ = 0x5a805a805a805a80;
            auVar17._10_2_ = 0x5a80;
            auVar17._12_2_ = 0x5a80;
            auVar17._14_2_ = 0x5a80;
            auVar17._16_2_ = 0x5a80;
            auVar17._18_2_ = 0x5a80;
            auVar17._20_2_ = 0x5a80;
            auVar17._22_2_ = 0x5a80;
            auVar17._24_2_ = 0x5a80;
            auVar17._26_2_ = 0x5a80;
            auVar17._28_2_ = 0x5a80;
            auVar17._30_2_ = 0x5a80;
            auVar18._8_2_ = 1;
            auVar18._0_8_ = 0x1000100010001;
            auVar18._10_2_ = 1;
            auVar18._12_2_ = 1;
            auVar18._14_2_ = 1;
            auVar18._16_2_ = 1;
            auVar18._18_2_ = 1;
            auVar18._20_2_ = 1;
            auVar18._22_2_ = 1;
            auVar18._24_2_ = 1;
            auVar18._26_2_ = 1;
            auVar18._28_2_ = 1;
            auVar18._30_2_ = 1;
            pauVar25 = pauVar24;
            do {
              auVar69 = vlddqu_avx(*pauVar25);
              auVar69 = vpackssdw_avx2(auVar69,pauVar25[1]);
              auVar69 = vpermq_avx2(auVar69,0xd8);
              auVar69 = vpmulhrsw_avx2(auVar69,auVar17);
              auVar74 = vpunpcklwd_avx2(auVar69,auVar18);
              auVar71 = vpunpckhwd_avx2(auVar69,auVar18);
              auVar69 = vpmaddwd_avx2(auVar74,auVar73);
              auVar74 = vpsrad_avx2(auVar69,auVar68);
              auVar69 = vpmaddwd_avx2(auVar71,auVar73);
              auVar69 = vpsrad_avx2(auVar69,auVar68);
              auVar69 = vpackssdw_avx2(auVar74,auVar69);
              *(undefined1 (*) [32])(puVar27 + lVar32) = auVar69;
              lVar32 = lVar32 + 0x20;
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + (long)(int)uVar29 * 4);
            } while (lVar32 != 0x200);
          }
          else {
            lVar32 = 0;
            auVar19._8_2_ = 1;
            auVar19._0_8_ = 0x1000100010001;
            auVar19._10_2_ = 1;
            auVar19._12_2_ = 1;
            auVar19._14_2_ = 1;
            auVar19._16_2_ = 1;
            auVar19._18_2_ = 1;
            auVar19._20_2_ = 1;
            auVar19._22_2_ = 1;
            auVar19._24_2_ = 1;
            auVar19._26_2_ = 1;
            auVar19._28_2_ = 1;
            auVar19._30_2_ = 1;
            pauVar25 = pauVar24;
            do {
              auVar69 = vlddqu_avx(*pauVar25);
              auVar69 = vpackssdw_avx2(auVar69,pauVar25[1]);
              auVar74 = vpermq_avx2(auVar69,0xd8);
              auVar69 = vpunpcklwd_avx2(auVar74,auVar19);
              auVar71 = vpunpckhwd_avx2(auVar74,auVar19);
              auVar69 = vpmaddwd_avx2(auVar69,auVar73);
              auVar74 = vpsrad_avx2(auVar69,auVar68);
              auVar69 = vpmaddwd_avx2(auVar71,auVar73);
              auVar69 = vpsrad_avx2(auVar69,auVar68);
              auVar69 = vpackssdw_avx2(auVar74,auVar69);
              *(undefined1 (*) [32])(puVar27 + lVar32) = auVar69;
              lVar32 = lVar32 + 0x20;
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + (long)(int)uVar29 * 4);
            } while (lVar32 != 0x200);
          }
          transpose_16bit_16x16_avx2
                    ((__m256i *)(local_8060 + uVar46 * 0x200),
                     (__m256i *)(local_8060 + uVar46 * 0x200));
          uVar46 = uVar46 + 1;
          puVar27 = puVar27 + 0x200;
          pauVar24 = pauVar24 + 2;
        } while (uVar46 != uVar48);
      }
      (*p_Var8)((__m256i *)local_8060,(__m256i *)local_8060);
      auVar56._0_2_ = (undefined2)(1 << (pcVar6[1] + 0xfU & 0x1f));
      auVar56._2_2_ = auVar56._0_2_;
      auVar56._4_2_ = auVar56._0_2_;
      auVar56._6_2_ = auVar56._0_2_;
      auVar56._8_2_ = auVar56._0_2_;
      auVar56._10_2_ = auVar56._0_2_;
      auVar56._12_2_ = auVar56._0_2_;
      auVar56._14_2_ = auVar56._0_2_;
      auVar56._16_2_ = auVar56._0_2_;
      auVar56._18_2_ = auVar56._0_2_;
      auVar56._20_2_ = auVar56._0_2_;
      auVar56._22_2_ = auVar56._0_2_;
      auVar56._24_2_ = auVar56._0_2_;
      auVar56._26_2_ = auVar56._0_2_;
      auVar56._28_2_ = auVar56._0_2_;
      auVar56._30_2_ = auVar56._0_2_;
      pauVar40 = (undefined1 (*) [16])output;
      uVar46 = uVar28;
      pauVar24 = (undefined1 (*) [32])(local_8060 + lVar41 * 0x20);
      do {
        auVar74 = vpmulhrsw_avx2(auVar56,*pauVar24);
        auVar69 = vpmovzxbw_avx2(*pauVar40);
        auVar69 = vpaddsw_avx2(auVar69,auVar74);
        auVar68 = vpackuswb_avx(auVar69._0_16_,auVar69._16_16_);
        *pauVar40 = auVar68;
        pauVar24 = (undefined1 (*) [32])(pauVar24[-1] + (((bVar42 | bVar51) & 1) << 6));
        pauVar40 = (undefined1 (*) [16])(*pauVar40 + stride);
        uVar46 = uVar46 - 1;
      } while (uVar46 != 0);
      lVar33 = lVar33 + 1;
      local_8b00 = local_8b00 + uVar29 * 0x10;
      output = (uint8_t *)((long)output + 0x10);
    } while (lVar33 != local_8a80._0_8_);
    return;
  case 0xb:
  case 0xd:
  case 0xf:
    uVar48 = tx_size_high[tx_size];
    uVar23 = 0x20;
    if ((int)uVar48 < 0x20) {
      uVar23 = uVar48;
    }
    if (eob < (int)uVar23) {
      iVar39 = eob_fill[eob + -1];
    }
    else {
      iVar39 = uVar23 - 1;
    }
    uVar46 = (ulong)((uint)tx_size * 4);
    uVar3 = *(uint *)((long)tx_size_wide + uVar46);
    uVar29 = iVar39 + 0x10 >> 4;
    local_8c00 = 0;
    if (uVar3 != uVar48) {
      if ((int)uVar48 < (int)uVar3) {
        local_8c00 = 1;
        if ((uVar48 * 2 == uVar3) || (local_8c00 = 2, uVar48 << 2 == uVar3)) goto LAB_0042b50f;
      }
      else {
        local_8c00 = -1;
        if ((uVar3 * 2 == uVar48) || (local_8c00 = -2, uVar3 * 4 == uVar48)) goto LAB_0042b50f;
      }
      local_8c00 = 0;
    }
LAB_0042b50f:
    if ((int)uVar29 < 1) {
      return;
    }
    pbVar7 = (byte *)av1_inv_txfm_shift_ls[tx_size];
    iVar39 = *(int *)((long)tx_size_high_log2 + uVar46);
    uVar43 = (int)uVar3 >> 4;
    uVar48 = (eob_fill[(eob + -1) / (int)uVar23] & 0xfffffff8U) + 8;
    p_Var8 = lowbd_txfm_all_1d_zeros_w16_arr[(long)*(int *)((long)tx_size_wide_log2 + uVar46) + -2]
             [""[uVar28]][lowbd_txfm_all_1d_zeros_idx[eob_fill[(eob + -1) / (int)uVar23]]];
    uVar46 = (ulong)uVar43;
    uVar28 = 0;
    auVar64._8_2_ = 0x5a80;
    auVar64._0_8_ = 0x5a805a805a805a80;
    auVar64._10_2_ = 0x5a80;
    auVar64._12_2_ = 0x5a80;
    auVar64._14_2_ = 0x5a80;
    auVar64._16_2_ = 0x5a80;
    auVar64._18_2_ = 0x5a80;
    auVar64._20_2_ = 0x5a80;
    auVar64._22_2_ = 0x5a80;
    auVar64._24_2_ = 0x5a80;
    auVar64._26_2_ = 0x5a80;
    auVar64._28_2_ = 0x5a80;
    auVar64._30_2_ = 0x5a80;
    local_8a80._8_2_ = 0x800;
    local_8a80._0_8_ = 0x800080008000800;
    local_8a80._10_2_ = 0x800;
    local_8a80._12_2_ = 0x800;
    local_8a80._14_2_ = 0x800;
    local_8a80._16_2_ = 0x800;
    local_8a80._18_2_ = 0x800;
    local_8a80._20_2_ = 0x800;
    local_8a80._22_2_ = 0x800;
    local_8a80._24_2_ = 0x800;
    local_8a80._26_2_ = 0x800;
    local_8a80._28_2_ = 0x800;
    local_8a80._30_2_ = 0x800;
    auVar84._8_2_ = 1;
    auVar84._0_8_ = 0x1000100010001;
    auVar84._10_2_ = 1;
    auVar84._12_2_ = 1;
    auVar84._14_2_ = 1;
    auVar84._16_2_ = 1;
    auVar84._18_2_ = 1;
    auVar84._20_2_ = 1;
    auVar84._22_2_ = 1;
    auVar84._24_2_ = 1;
    auVar84._26_2_ = 1;
    auVar84._28_2_ = 1;
    auVar84._30_2_ = 1;
    do {
      palVar38 = (__m256i *)local_8860;
      uVar37 = (ulong)uVar48;
      pauVar24 = (undefined1 (*) [32])input;
      palVar26 = palVar38;
      do {
        auVar69 = vlddqu_avx(*pauVar24);
        auVar69 = vpackssdw_avx2(auVar69,pauVar24[1]);
        alVar10 = (__m256i)vpermq_avx2(auVar69,0xd8);
        *palVar26 = alVar10;
        palVar26 = palVar26 + 1;
        pauVar24 = (undefined1 (*) [32])(*pauVar24 + (long)(int)uVar23 * 4);
        uVar37 = uVar37 - 1;
      } while (uVar37 != 0);
      if ((local_8c00 == 1) || (local_8c00 == -1)) {
        uVar37 = (ulong)uVar48;
        palVar26 = palVar38;
        do {
          alVar10 = (__m256i)vpmulhrsw_avx2(auVar64,(undefined1  [32])*palVar26);
          *palVar26 = alVar10;
          palVar26 = palVar26 + 1;
          uVar37 = uVar37 - 1;
        } while (uVar37 != 0);
      }
      (*p_Var8)(palVar38,palVar38);
      bVar42 = *pbVar7;
      if ((char)bVar42 < '\0') {
        auVar57._0_2_ = (undefined2)(1 << (~bVar42 & 0x1f));
        auVar57._2_2_ = auVar57._0_2_;
        auVar57._4_2_ = auVar57._0_2_;
        auVar57._6_2_ = auVar57._0_2_;
        auVar57._8_2_ = auVar57._0_2_;
        auVar57._10_2_ = auVar57._0_2_;
        auVar57._12_2_ = auVar57._0_2_;
        auVar57._14_2_ = auVar57._0_2_;
        auVar57._16_2_ = auVar57._0_2_;
        auVar57._18_2_ = auVar57._0_2_;
        auVar57._20_2_ = auVar57._0_2_;
        auVar57._22_2_ = auVar57._0_2_;
        auVar57._24_2_ = auVar57._0_2_;
        auVar57._26_2_ = auVar57._0_2_;
        auVar57._28_2_ = auVar57._0_2_;
        auVar57._30_2_ = auVar57._0_2_;
        palVar26 = palVar38;
        uVar37 = (ulong)uVar3;
        do {
          auVar69 = vpaddsw_avx2(auVar57,(undefined1  [32])*palVar26);
          alVar10 = (__m256i)vpsraw_avx2(auVar69,ZEXT416((uint)-(int)(char)bVar42));
          *palVar26 = alVar10;
          palVar26 = palVar26 + 1;
          uVar37 = uVar37 - 1;
        } while (uVar37 != 0);
      }
      else {
        palVar26 = palVar38;
        uVar37 = (ulong)uVar3;
        if (bVar42 != 0) {
          do {
            alVar10 = (__m256i)vpsllw_avx2((undefined1  [32])*palVar26,
                                           ZEXT416((uint)(int)(char)bVar42));
            *palVar26 = alVar10;
            uVar37 = uVar37 - 1;
            palVar26 = palVar26 + 1;
          } while (uVar37 != 0);
        }
      }
      if (tx_type == '\x0f') {
        if (0 < (int)uVar43) {
          uVar37 = 0;
          do {
            lVar41 = 0x200;
            palVar26 = palVar38;
            do {
              lVar14 = (*palVar26)[1];
              lVar15 = (*palVar26)[2];
              lVar16 = (*palVar26)[3];
              *(longlong *)(local_8a80 + lVar41) = (*palVar26)[0];
              *(longlong *)(local_8a80 + lVar41 + 8) = lVar14;
              *(longlong *)(local_8a80 + lVar41 + 0x10) = lVar15;
              *(longlong *)(local_8a80 + lVar41 + 0x18) = lVar16;
              palVar26 = palVar26 + 1;
              lVar41 = lVar41 + -0x20;
            } while (lVar41 != 0);
            transpose_16bit_16x16_avx2
                      ((__m256i *)local_8a60,(__m256i *)(local_8060 + (~uVar37 + uVar46) * 0x200));
            uVar37 = uVar37 + 1;
            palVar38 = palVar38 + 0x10;
          } while (uVar37 != uVar46);
LAB_0042b79c:
          if (0 < (int)uVar43) {
            uVar52 = (undefined2)tx_size_high_log2[(long)iVar39 + 0x12];
            auVar58._2_2_ = uVar52;
            auVar58._0_2_ = uVar52;
            auVar58._4_2_ = uVar52;
            auVar58._6_2_ = uVar52;
            auVar58._8_2_ = uVar52;
            auVar58._10_2_ = uVar52;
            auVar58._12_2_ = uVar52;
            auVar58._14_2_ = uVar52;
            auVar58._16_2_ = uVar52;
            auVar58._18_2_ = uVar52;
            auVar58._20_2_ = uVar52;
            auVar58._22_2_ = uVar52;
            auVar58._24_2_ = uVar52;
            auVar58._26_2_ = uVar52;
            auVar58._28_2_ = uVar52;
            auVar58._30_2_ = uVar52;
            auVar69 = vpunpcklwd_avx2(auVar58,local_8a80);
            puVar27 = local_8060;
            uVar37 = 0;
            do {
              pauVar40 = (undefined1 (*) [16])
                         (output + uVar37 * 0x10 + uVar28 * 0x10 * (long)stride);
              bVar42 = pbVar7[1];
              iVar30 = 1 << (~bVar42 & 0x1f);
              auVar65._4_4_ = iVar30;
              auVar65._0_4_ = iVar30;
              auVar65._8_4_ = iVar30;
              auVar65._12_4_ = iVar30;
              auVar65._16_4_ = iVar30;
              auVar65._20_4_ = iVar30;
              auVar65._24_4_ = iVar30;
              auVar65._28_4_ = iVar30;
              lVar41 = 0;
              do {
                auVar74 = vpunpcklwd_avx2(*(undefined1 (*) [32])(puVar27 + lVar41),auVar84);
                auVar71 = vpunpckhwd_avx2(*(undefined1 (*) [32])(puVar27 + lVar41),auVar84);
                auVar74 = vpmaddwd_avx2(auVar74,auVar69);
                auVar71 = vpmaddwd_avx2(auVar71,auVar69);
                auVar74 = vpsrad_avx2(auVar74,0xc);
                auVar71 = vpsrad_avx2(auVar71,0xc);
                auVar74 = vpaddd_avx2(auVar74,auVar65);
                auVar71 = vpaddd_avx2(auVar71,auVar65);
                auVar68 = ZEXT416((uint)-(int)(char)bVar42);
                auVar74 = vpsrad_avx2(auVar74,auVar68);
                auVar59 = vpsrad_avx2(auVar71,auVar68);
                auVar71 = vpmovzxbw_avx2(*pauVar40);
                auVar74 = vpackssdw_avx2(auVar74,auVar59);
                auVar74 = vpaddsw_avx2(auVar71,auVar74);
                auVar68 = vpackuswb_avx(auVar74._0_16_,auVar74._16_16_);
                *pauVar40 = auVar68;
                pauVar40 = (undefined1 (*) [16])(*pauVar40 + stride);
                lVar41 = lVar41 + 0x20;
              } while (lVar41 != 0x200);
              uVar37 = uVar37 + 1;
              puVar27 = puVar27 + 0x200;
            } while (uVar37 != uVar46);
          }
        }
      }
      else if (0 < (int)uVar43) {
        palVar26 = (__m256i *)local_8060;
        uVar37 = uVar46;
        do {
          transpose_16bit_16x16_avx2(palVar38,palVar26);
          palVar26 = palVar26 + 0x10;
          palVar38 = palVar38 + 0x10;
          uVar37 = uVar37 - 1;
        } while (uVar37 != 0);
        goto LAB_0042b79c;
      }
      uVar28 = uVar28 + 1;
      input = (int32_t *)((long)input + 0x40);
      if (uVar28 == uVar29) {
        return;
      }
    } while( true );
  default:
switchD_0042a93d_default:
    av1_lowbd_inv_txfm2d_add_ssse3(input,output,stride,tx_type,tx_size,eob);
    return;
  }
  local_8ba0 = 0;
  uStack_8b9e = 0;
  uVar48 = 0;
  iVar39 = 0;
  if (eob != 1) {
    uVar48 = (int)av1_eob_to_eobxy_default[tx_size]
                  [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + tx_size) & 0x1f)] & 0xff;
    iVar39 = (int)av1_eob_to_eobxy_default[tx_size]
                  [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + tx_size) & 0x1f)] >> 8;
  }
  pcVar6 = av1_inv_txfm_shift_ls[tx_size];
  uVar23 = tx_size_wide[tx_size];
  uVar3 = tx_size_high[tx_size];
  uVar46 = (ulong)uVar3;
  lVar41 = (long)(int)uVar3;
  uVar43 = (int)uVar23 >> 4;
  uVar34 = iVar39 + 0x10 >> 4;
  uVar29 = 0x20;
  if ((int)uVar3 < 0x20) {
    uVar29 = uVar3;
  }
  if (uVar23 == uVar3) goto LAB_0042a9fb;
  if ((int)uVar3 < (int)uVar23) {
    local_8ba0 = 1;
    uStack_8b9e = 0;
    if (uVar3 * 2 == uVar23) goto LAB_0042a9fb;
    local_8ba0 = 2;
    uStack_8b9e = 0;
    if (uVar3 * 4 == uVar23) goto LAB_0042a9fb;
  }
  else {
    local_8ba0 = 0xffff;
    uStack_8b9e = 0xffff;
    if (uVar23 * 2 == uVar3) goto LAB_0042a9fb;
    local_8ba0 = 0xfffe;
    uStack_8b9e = 0xffff;
    if (uVar23 * 4 == uVar3) goto LAB_0042a9fb;
  }
  local_8ba0 = 0;
  uStack_8b9e = 0;
LAB_0042a9fb:
  bVar51 = 8 < tx_type;
  uVar47 = 0xaf >> (tx_type & 0x1f);
  p_Var8 = lowbd_txfm_all_1d_zeros_w16_arr[(long)tx_size_high_log2[tx_size] + -2][""[uVar28]]
           [lowbd_txfm_all_1d_zeros_idx[iVar39]];
  uVar37 = (ulong)uVar43;
  if (0 < (int)uVar34) {
    p_Var4 = lowbd_txfm_all_1d_zeros_w16_arr[(long)tx_size_wide_log2[tx_size] + -2][""[uVar28]]
             [lowbd_txfm_all_1d_zeros_idx[uVar48]];
    local_8aa0._2_2_ = (undefined2)(1 << (*pcVar6 + 0xfU & 0x1f));
    uVar11 = uVar23;
    if ((int)uVar23 < 2) {
      uVar11 = 1;
    }
    local_8ac0 = (undefined2)uVar43;
    sStack_8abe = (short)((int)uVar23 >> 0x14);
    sStack_8abc = (short)((int)uVar23 >> 0xf);
    lVar33 = (ulong)((uVar48 & 0xf0) << 5) + 0x200;
    palVar26 = (__m256i *)local_8060;
    uVar28 = 0;
    local_8a80._8_2_ = 0x5a80;
    local_8a80._0_8_ = 0x5a805a805a805a80;
    local_8a80._10_2_ = 0x5a80;
    local_8a80._12_2_ = 0x5a80;
    local_8a80._14_2_ = 0x5a80;
    local_8a80._16_2_ = 0x5a80;
    local_8a80._18_2_ = 0x5a80;
    local_8a80._20_2_ = 0x5a80;
    local_8a80._22_2_ = 0x5a80;
    local_8a80._24_2_ = 0x5a80;
    local_8a80._26_2_ = 0x5a80;
    local_8a80._28_2_ = 0x5a80;
    local_8a80._30_2_ = 0x5a80;
    local_8aa0._0_2_ = local_8aa0._2_2_;
    local_8aa0._4_2_ = local_8aa0._2_2_;
    local_8aa0._6_2_ = local_8aa0._2_2_;
    local_8aa0._8_2_ = local_8aa0._2_2_;
    local_8aa0._10_2_ = local_8aa0._2_2_;
    local_8aa0._12_2_ = local_8aa0._2_2_;
    local_8aa0._14_2_ = local_8aa0._2_2_;
    local_8aa0._16_2_ = local_8aa0._2_2_;
    local_8aa0._18_2_ = local_8aa0._2_2_;
    local_8aa0._20_2_ = local_8aa0._2_2_;
    local_8aa0._22_2_ = local_8aa0._2_2_;
    local_8aa0._24_2_ = local_8aa0._2_2_;
    local_8aa0._26_2_ = local_8aa0._2_2_;
    local_8aa0._28_2_ = local_8aa0._2_2_;
    local_8aa0._30_2_ = local_8aa0._2_2_;
    do {
      lVar32 = 0;
      pauVar24 = (undefined1 (*) [32])input;
      do {
        auVar69 = vlddqu_avx(*pauVar24);
        auVar69 = vpackssdw_avx2(auVar69,pauVar24[1]);
        auVar69 = vpermq_avx2(auVar69,0xd8);
        *(undefined1 (*) [32])(local_8860 + lVar32) = auVar69;
        lVar32 = lVar32 + 0x20;
        pauVar24 = (undefined1 (*) [32])(*pauVar24 + (long)(int)uVar29 * 4);
      } while (lVar33 != lVar32);
      if ((CONCAT22(uStack_8b9e,local_8ba0) == 1) || (CONCAT22(uStack_8b9e,local_8ba0) == -1)) {
        lVar32 = 0;
        do {
          auVar69 = vpmulhrsw_avx2(local_8a80,*(undefined1 (*) [32])(local_8860 + lVar32));
          *(undefined1 (*) [32])(local_8860 + lVar32) = auVar69;
          lVar32 = lVar32 + 0x20;
        } while (lVar33 != lVar32);
      }
      (*p_Var4)((__m256i *)local_8860,(__m256i *)local_8860);
      lVar32 = 0;
      do {
        auVar69 = vpmulhrsw_avx2(local_8aa0,*(undefined1 (*) [32])(local_8860 + lVar32));
        *(undefined1 (*) [32])(local_8860 + lVar32) = auVar69;
        lVar32 = lVar32 + 0x20;
      } while ((ulong)uVar11 << 5 != lVar32);
      if ((0x11fU >> (tx_type & 0x1f) & 1) == 0 && !bVar51) {
        if (0 < (int)uVar43) {
          puVar45 = (undefined8 *)local_8860;
          uVar50 = 0;
          do {
            lVar32 = 0x200;
            puVar31 = puVar45;
            do {
              uVar9 = puVar31[1];
              uVar12 = puVar31[2];
              uVar13 = puVar31[3];
              *(undefined8 *)(local_8a80 + lVar32) = *puVar31;
              *(undefined8 *)(local_8a80 + lVar32 + 8) = uVar9;
              *(undefined8 *)(local_8a80 + lVar32 + 0x10) = uVar12;
              *(undefined8 *)(local_8a80 + lVar32 + 0x18) = uVar13;
              puVar31 = puVar31 + 4;
              lVar32 = lVar32 + -0x20;
            } while (lVar32 != 0);
            transpose_16bit_16x16_avx2
                      ((__m256i *)local_8a60,
                       (__m256i *)
                       (local_8060 +
                       (~uVar50 +
                       CONCAT26(sStack_8abc,CONCAT24(sStack_8abc,CONCAT22(sStack_8abe,local_8ac0))))
                       * lVar41 * 0x20 + uVar28 * 0x200));
            uVar50 = uVar50 + 1;
            puVar45 = puVar45 + 0x40;
          } while (uVar50 != uVar37);
        }
      }
      else if (0 < (int)uVar43) {
        palVar38 = (__m256i *)local_8860;
        out = palVar26;
        uVar50 = uVar37;
        do {
          transpose_16bit_16x16_avx2(palVar38,out);
          out = out + lVar41;
          palVar38 = palVar38 + 0x10;
          uVar50 = uVar50 - 1;
        } while (uVar50 != 0);
      }
      uVar28 = uVar28 + 1;
      input = (int32_t *)((long)input + 0x40);
      palVar26 = palVar26 + 0x10;
    } while (uVar28 != uVar34);
  }
  if ((int)uVar43 < 1) {
    return;
  }
  uVar52 = (undefined2)(1 << (pcVar6[1] + 0xfU & 0x1f));
  uVar28 = 1;
  if (1 < (int)uVar3) {
    uVar28 = uVar46;
  }
  puVar27 = local_8060;
  uVar50 = 0;
  do {
    (*p_Var8)((__m256i *)(local_8060 + uVar50 * lVar41 * 0x20),
              (__m256i *)(local_8060 + uVar50 * lVar41 * 0x20));
    auVar20._2_2_ = uVar52;
    auVar20._0_2_ = uVar52;
    auVar20._4_2_ = uVar52;
    auVar20._6_2_ = uVar52;
    auVar20._8_2_ = uVar52;
    auVar20._10_2_ = uVar52;
    auVar20._12_2_ = uVar52;
    auVar20._14_2_ = uVar52;
    auVar20._16_2_ = uVar52;
    auVar20._18_2_ = uVar52;
    auVar20._20_2_ = uVar52;
    auVar20._22_2_ = uVar52;
    auVar20._24_2_ = uVar52;
    auVar20._26_2_ = uVar52;
    auVar20._28_2_ = uVar52;
    auVar20._30_2_ = uVar52;
    lVar33 = 0;
    do {
      auVar69 = vpmulhrsw_avx2(auVar20,*(undefined1 (*) [32])(puVar27 + lVar33));
      *(undefined1 (*) [32])(puVar27 + lVar33) = auVar69;
      lVar33 = lVar33 + 0x20;
    } while (uVar28 * 0x20 != lVar33);
    uVar50 = uVar50 + 1;
    puVar27 = puVar27 + lVar41 * 0x20;
  } while (uVar50 != uVar37);
  uVar50 = 0;
  uVar28 = (ulong)(uVar3 - 1);
  if (bVar51 || (uVar47 & 1) != 0) {
    uVar28 = uVar50;
  }
  pauVar25 = (undefined1 (*) [32])(local_8060 + uVar28 * 0x20);
  uVar28 = uVar46;
  pauVar40 = (undefined1 (*) [16])output;
  pauVar24 = pauVar25;
  do {
    do {
      auVar69 = vpmovzxbw_avx2(*(undefined1 (*) [16])output);
      auVar69 = vpaddsw_avx2(auVar69,*pauVar25);
      auVar68 = vpackuswb_avx(auVar69._0_16_,auVar69._16_16_);
      *(undefined1 (*) [16])output = auVar68;
      pauVar25 = (undefined1 (*) [32])(pauVar25[-1] + (((byte)(bVar51 | (byte)uVar47) & 1) << 6));
      output = *(undefined1 (*) [16])output + stride;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
    uVar50 = uVar50 + 1;
    pauVar25 = pauVar24 + lVar41;
    output = (uint8_t *)(pauVar40 + 1);
    uVar28 = uVar46;
    pauVar40 = (undefined1 (*) [16])output;
    pauVar24 = pauVar25;
  } while (uVar50 != uVar37);
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_avx2(const int32_t *input, uint8_t *output,
                                   int stride, TX_TYPE tx_type, TX_SIZE tx_size,
                                   int eob) {
  switch (tx_size) {
    case TX_4X4:
    case TX_4X8:
    case TX_8X4:
    case TX_8X16:
    case TX_16X8:
    case TX_4X16:
    case TX_16X4:
    case TX_8X32:
    case TX_32X8:
      av1_lowbd_inv_txfm2d_add_ssse3(input, output, stride, tx_type, tx_size,
                                     eob);
      break;
    case TX_8X8:
      lowbd_inv_txfm2d_add_8x8_avx2(input, output, stride, tx_type, tx_size,
                                    eob);
      break;
    case TX_16X16:
    case TX_32X32:
    case TX_64X64:
    case TX_16X32:
    case TX_32X16:
    case TX_32X64:
    case TX_64X32:
    case TX_16X64:
    case TX_64X16:
    default:
      lowbd_inv_txfm2d_add_universe_avx2(input, output, stride, tx_type,
                                         tx_size, eob);
      break;
  }
}